

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

FloatTextureHandle __thiscall
pbrt::FloatTextureHandle::Create
          (FloatTextureHandle *this,string *name,Transform *renderFromTexture,
          TextureParameterDictionary *parameters,FileLoc *loc,Allocator alloc,bool gpu)

{
  bool bVar1;
  FloatCheckerboardTexture *pFVar2;
  ulong uVar3;
  FloatDotsTexture *pFVar4;
  TextureParameterDictionary *loc_00;
  FileLoc *loc_01;
  FileLoc *loc_02;
  FileLoc *loc_03;
  FileLoc *loc_04;
  FileLoc *loc_05;
  FileLoc *loc_06;
  Transform *pTVar5;
  char *pcVar6;
  long in_FS_OFFSET;
  TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  local_38;
  
  loc_00 = parameters;
  pTVar5 = (Transform *)name;
  bVar1 = std::operator==(name,"constant");
  if (bVar1) {
    pFVar2 = (FloatCheckerboardTexture *)
             FloatConstantTexture::Create(pTVar5,parameters,loc_01,alloc);
    uVar3 = 0x5000000000000;
LAB_00399fe1:
    local_38.bits = uVar3 | (ulong)pFVar2;
  }
  else {
    pTVar5 = (Transform *)0x28494c5;
    bVar1 = std::operator==(name,"scale");
    if (!bVar1) {
      pTVar5 = (Transform *)name;
      bVar1 = std::operator==(name,"mix");
      if (bVar1) {
        pFVar2 = (FloatCheckerboardTexture *)FloatMixTexture::Create(pTVar5,parameters,loc_02,alloc)
        ;
        uVar3 = 0x3000000000000;
      }
      else {
        bVar1 = std::operator==(name,"bilerp");
        if (bVar1) {
          pFVar2 = (FloatCheckerboardTexture *)
                   FloatBilerpTexture::Create(renderFromTexture,parameters,loc,alloc);
          uVar3 = 0x6000000000000;
        }
        else {
          bVar1 = std::operator==(name,"imagemap");
          if (bVar1) {
            if (gpu) {
              LogFatal(Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/textures.h"
                       ,0x2f4,"GPUFloatImageTexture::Create called in non-GPU configuration.");
            }
            pFVar2 = (FloatCheckerboardTexture *)
                     FloatImageTexture::Create(renderFromTexture,parameters,loc,alloc);
            uVar3 = 0x1000000000000;
          }
          else {
            bVar1 = std::operator==(name,"checkerboard");
            if (bVar1) {
              pFVar2 = FloatCheckerboardTexture::Create(renderFromTexture,parameters,loc,alloc);
              uVar3 = 0x7000000000000;
            }
            else {
              bVar1 = std::operator==(name,"dots");
              if (bVar1) {
                pFVar4 = FloatDotsTexture::Create(renderFromTexture,parameters,loc,alloc);
                local_38.bits = (ulong)pFVar4 | 0x8000000000000;
                goto LAB_0039a010;
              }
              bVar1 = std::operator==(name,"fbm");
              if (bVar1) {
                pFVar2 = (FloatCheckerboardTexture *)
                         FBmTexture::Create(renderFromTexture,parameters,loc_03,alloc);
                uVar3 = 0x9000000000000;
              }
              else {
                bVar1 = std::operator==(name,"wrinkled");
                if (bVar1) {
                  pFVar2 = (FloatCheckerboardTexture *)
                           WrinkledTexture::Create(renderFromTexture,parameters,loc_04,alloc);
                  uVar3 = 0xc000000000000;
                }
                else {
                  pcVar6 = "windy";
                  bVar1 = std::operator==(name,"windy");
                  if (bVar1) {
                    pFVar2 = (FloatCheckerboardTexture *)
                             WindyTexture::Create
                                       (renderFromTexture,(TextureParameterDictionary *)pcVar6,
                                        loc_05,alloc);
                    uVar3 = 0xb000000000000;
                  }
                  else {
                    pTVar5 = (Transform *)name;
                    bVar1 = std::operator==(name,"ptex");
                    if (!bVar1) {
                      pcVar6 = "%s: float texture type unknown.";
                      goto LAB_0039a218;
                    }
                    if (gpu) {
                      ErrorExit(loc,"ptex texture is not supported on the GPU.");
                    }
                    pFVar2 = (FloatCheckerboardTexture *)
                             FloatPtexTexture::Create(pTVar5,parameters,loc_06,alloc);
                    uVar3 = 0xa000000000000;
                  }
                }
              }
            }
          }
        }
      }
      goto LAB_00399fe1;
    }
    FloatScaledTexture::Create
              ((FloatScaledTexture *)&local_38,pTVar5,parameters,(FileLoc *)loc_00,alloc);
  }
LAB_0039a010:
  (this->
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  ).bits = local_38.bits;
  if ((local_38.bits & 0xffffffffffff) != 0) {
    *(long *)(in_FS_OFFSET + -0x178) = *(long *)(in_FS_OFFSET + -0x178) + 1;
    return (FloatTextureHandle)
           (TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
            )this;
  }
  pcVar6 = "%s: unable to create texture.";
LAB_0039a218:
  ErrorExit<std::__cxx11::string_const&>(loc,pcVar6,name);
}

Assistant:

FloatTextureHandle FloatTextureHandle::Create(
    const std::string &name, const Transform &renderFromTexture,
    const TextureParameterDictionary &parameters, const FileLoc *loc, Allocator alloc,
    bool gpu) {
    FloatTextureHandle tex;
    if (name == "constant")
        tex = FloatConstantTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "scale")
        tex = FloatScaledTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "mix")
        tex = FloatMixTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "bilerp")
        tex = FloatBilerpTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "imagemap") {
        if (gpu)
            tex = GPUFloatImageTexture::Create(renderFromTexture, parameters, loc, alloc);
        else
            tex = FloatImageTexture::Create(renderFromTexture, parameters, loc, alloc);
    } else if (name == "checkerboard")
        tex = FloatCheckerboardTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "dots")
        tex = FloatDotsTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "fbm")
        tex = FBmTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "wrinkled")
        tex = WrinkledTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "windy")
        tex = WindyTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "ptex") {
        if (gpu)
            ErrorExit(loc, "ptex texture is not supported on the GPU.");
        else
            tex = FloatPtexTexture::Create(renderFromTexture, parameters, loc, alloc);
    } else
        ErrorExit(loc, "%s: float texture type unknown.", name);

    if (!tex)
        ErrorExit(loc, "%s: unable to create texture.", name);

    ++nTextures;

    // FIXME: reenable this once we handle all the same image texture parameters
    // CO    parameters.ReportUnused();
    return tex;
}